

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

fsg_model_t * jsgf_read_string(char *string,logmath_t *lmath,float32 lw)

{
  int iVar1;
  jsgf_t *grammar;
  jsgf_rule_iter_t *local_48;
  jsgf_rule_iter_t *itor;
  jsgf_t *jsgf;
  jsgf_rule_t *rule;
  fsg_model_t *fsg;
  float32 lw_local;
  logmath_t *lmath_local;
  char *string_local;
  
  grammar = jsgf_parse_string(string,(jsgf_t *)0x0);
  if (grammar == (jsgf_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
            ,0x244,"Error parsing input string\n");
    string_local = (char *)0x0;
  }
  else {
    jsgf = (jsgf_t *)0x0;
    for (local_48 = jsgf_rule_iter(grammar); local_48 != (jsgf_rule_iter_t *)0x0;
        local_48 = jsgf_rule_iter_next(local_48)) {
      jsgf = (jsgf_t *)jsgf_rule_iter_rule(local_48);
      iVar1 = jsgf_rule_public((jsgf_rule_t *)jsgf);
      if (iVar1 != 0) {
        jsgf_rule_iter_free(local_48);
        break;
      }
    }
    if (jsgf == (jsgf_t *)0x0) {
      jsgf_grammar_free(grammar);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
              ,0x253,"No public rules found in input string\n");
      string_local = (char *)0x0;
    }
    else {
      string_local = (char *)jsgf_build_fsg(grammar,(jsgf_rule_t *)jsgf,lmath,lw);
      jsgf_grammar_free(grammar);
    }
  }
  return (fsg_model_t *)string_local;
}

Assistant:

fsg_model_t *
jsgf_read_string(const char *string, logmath_t * lmath, float32 lw)
{
    fsg_model_t *fsg;
    jsgf_rule_t *rule;
    jsgf_t *jsgf;
    jsgf_rule_iter_t *itor;

    if ((jsgf = jsgf_parse_string(string, NULL)) == NULL) {
        E_ERROR("Error parsing input string\n");
        return NULL;
    }

    rule = NULL;
    for (itor = jsgf_rule_iter(jsgf); itor;
         itor = jsgf_rule_iter_next(itor)) {
        rule = jsgf_rule_iter_rule(itor);
        if (jsgf_rule_public(rule)) {
            jsgf_rule_iter_free(itor);
            break;
        }
    }
    if (rule == NULL) {
        jsgf_grammar_free(jsgf);
        E_ERROR("No public rules found in input string\n");
        return NULL;
    }
    fsg = jsgf_build_fsg(jsgf, rule, lmath, lw);
    jsgf_grammar_free(jsgf);
    return fsg;
}